

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitCIELab8
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  float Z;
  float Y;
  float X;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  X = (float)w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  for (Y = (float)h; Y != 0.0; Y = (float)((int)Y + -1)) {
    for (w_local = (uint32_t)X; w_local != 0; w_local = w_local - 1) {
      TIFFCIELabToXYZ(*(TIFFCIELabToRGB **)(cp_local + 0x1c),(uint)*pp,(int)(char)pp[1],
                      (int)(char)pp[2],&Z,(float *)&r,(float *)&g);
      TIFFXYZToRGB(*(TIFFCIELabToRGB **)(cp_local + 0x1c),Z,(float)r,(float)g,&b,&local_3c,&local_40
                  );
      *_y_local = b | local_3c << 8 | local_40 << 0x10 | 0xff000000;
      pp = pp + 3;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew * 3;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitCIELab8)
{
    float X, Y, Z;
    uint32_t r, g, b;
    (void)y;
    fromskew *= 3;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            TIFFCIELabToXYZ(img->cielab, (unsigned char)pp[0],
                            (signed char)pp[1], (signed char)pp[2], &X, &Y, &Z);
            TIFFXYZToRGB(img->cielab, X, Y, Z, &r, &g, &b);
            *cp++ = PACK(r, g, b);
            pp += 3;
        }
        cp += toskew;
        pp += fromskew;
    }
}